

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageControl::paintEvent(PageControl *this,QPaintEvent *param_1)

{
  int iVar1;
  int iVar2;
  PageControlPrivate *pPVar3;
  reference pQVar4;
  QPoint local_50;
  QBrush local_48 [8];
  QPoint local_40;
  QBrush local_38 [8];
  int local_30;
  int i;
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  PageControl *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)local_20,true);
  QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
  ::operator->(&this->d);
  QPainter::setPen((QColor *)local_20);
  local_30 = 0;
  while( true ) {
    iVar1 = local_30;
    pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
             ::operator->(&this->d);
    iVar2 = local_30;
    if (pPVar3->count <= iVar1) break;
    pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
             ::operator->(&this->d);
    if (iVar2 == pPVar3->currentIndex) {
      pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      QBrush::QBrush(local_38,(QColor *)&pPVar3->currentPageIndicatorColor,SolidPattern);
      QPainter::setBrush((QBrush *)local_20);
      QBrush::~QBrush(local_38);
      pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      pQVar4 = QList<QRect>::operator[](&pPVar3->rectangles,(long)local_30);
      local_40 = QRect::center(pQVar4);
      pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      iVar1 = pPVar3->radius;
      pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      QPainter::drawEllipse(local_20,&local_40,iVar1,pPVar3->radius);
    }
    else {
      pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      QBrush::QBrush(local_48,(QColor *)&pPVar3->pageIndicatorColor,SolidPattern);
      QPainter::setBrush((QBrush *)local_20);
      QBrush::~QBrush(local_48);
      pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      pQVar4 = QList<QRect>::operator[](&pPVar3->rectangles,(long)local_30);
      local_50 = QRect::center(pQVar4);
      pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      iVar1 = pPVar3->smallRadius;
      pPVar3 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      QPainter::drawEllipse(local_20,&local_50,iVar1,pPVar3->smallRadius);
    }
    local_30 = local_30 + 1;
  }
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void
PageControl::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.setPen( d->pageIndicatorColor );

	for( int i = 0; i < d->count; ++i )
	{
		if( i == d->currentIndex )
		{
			p.setBrush( d->currentPageIndicatorColor );

			p.drawEllipse( d->rectangles[ i ].center(), d->radius, d->radius );
		}
		else
		{
			p.setBrush( d->pageIndicatorColor );

			p.drawEllipse( d->rectangles[ i ].center(),
				d->smallRadius, d->smallRadius );
		}
	}
}